

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void resetCursor(RtreeCursor *pCsr)

{
  Rtree *pRtree;
  void *p;
  sqlite3_stmt *psVar1;
  int iVar2;
  RtreeConstraint *p_00;
  long lVar3;
  long lVar4;
  
  pRtree = (Rtree *)(pCsr->base).pVtab;
  p_00 = pCsr->aConstraint;
  if (p_00 != (RtreeConstraint *)0x0) {
    iVar2 = pCsr->nConstraint;
    if (0 < iVar2) {
      lVar3 = 0x10;
      lVar4 = 0;
      do {
        p = *(void **)((long)&pCsr->aConstraint->iCoord + lVar3);
        if (p != (void *)0x0) {
          if (*(code **)((long)p + 0x20) != (code *)0x0) {
            (**(code **)((long)p + 0x20))(*(undefined8 *)((long)p + 0x18));
          }
          sqlite3_free(p);
          iVar2 = pCsr->nConstraint;
        }
        lVar4 = lVar4 + 1;
        lVar3 = lVar3 + 0x18;
      } while (lVar4 < iVar2);
      p_00 = pCsr->aConstraint;
    }
    sqlite3_free(p_00);
    pCsr->aConstraint = (RtreeConstraint *)0x0;
  }
  lVar3 = 0xb;
  do {
    nodeRelease(pRtree,pCsr->aNode[lVar3 + -0xb]);
    lVar3 = lVar3 + 1;
  } while (lVar3 != 0x10);
  sqlite3_free(pCsr->aPoint);
  psVar1 = pCsr->pReadAux;
  memset(pCsr,0,0x128);
  (pCsr->base).pVtab = (sqlite3_vtab *)pRtree;
  pCsr->pReadAux = psVar1;
  return;
}

Assistant:

static void resetCursor(RtreeCursor *pCsr){
  Rtree *pRtree = (Rtree *)(pCsr->base.pVtab);
  int ii;
  sqlite3_stmt *pStmt;
  if( pCsr->aConstraint ){
    int i;                        /* Used to iterate through constraint array */
    for(i=0; i<pCsr->nConstraint; i++){
      sqlite3_rtree_query_info *pInfo = pCsr->aConstraint[i].pInfo;
      if( pInfo ){
        if( pInfo->xDelUser ) pInfo->xDelUser(pInfo->pUser);
        sqlite3_free(pInfo);
      }
    }
    sqlite3_free(pCsr->aConstraint);
    pCsr->aConstraint = 0;
  }
  for(ii=0; ii<RTREE_CACHE_SZ; ii++) nodeRelease(pRtree, pCsr->aNode[ii]);
  sqlite3_free(pCsr->aPoint);
  pStmt = pCsr->pReadAux;
  memset(pCsr, 0, sizeof(RtreeCursor));
  pCsr->base.pVtab = (sqlite3_vtab*)pRtree;
  pCsr->pReadAux = pStmt;

}